

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amd_aat.c
# Opt level: O0

size_t amd_l_aat(longlong n,longlong *Ap,longlong *Ai,longlong *Len,longlong *Tp,c_float *Info)

{
  c_float cVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  undefined1 auVar6 [16];
  size_t local_98;
  c_float local_90;
  size_t nzaat;
  c_float sym;
  longlong nz;
  longlong nzboth;
  longlong nzdiag;
  longlong k;
  longlong pj2;
  longlong pj;
  longlong j;
  longlong i;
  longlong p;
  longlong p2;
  longlong p1;
  c_float *Info_local;
  longlong *Tp_local;
  longlong *Len_local;
  
  if (Info != (c_float *)0x0) {
    for (pj2 = 0; pj2 < 0x14; pj2 = pj2 + 1) {
      Info[pj2] = -1.0;
    }
    *Info = 0.0;
  }
  for (nz = 0; nz < n; nz = nz + 1) {
    Len[nz] = 0;
  }
  sym = 0.0;
  nzaat = 0;
  cVar1 = (c_float)Ap[n];
  nz = 0;
  do {
    if (n <= nz) {
      for (k = 0; k < n; k = k + 1) {
        for (nzdiag = Tp[k]; nzdiag < Ap[k + 1]; nzdiag = nzdiag + 1) {
          Len[Ai[nzdiag]] = Len[Ai[nzdiag]] + 1;
          Len[k] = Len[k] + 1;
        }
      }
      if (cVar1 == sym) {
        local_90 = 1.0;
      }
      else {
        local_90 = ((double)(long)nzaat * 2.0) / (double)((long)cVar1 - (long)sym);
      }
      local_98 = 0;
      for (nz = 0; nz < n; nz = nz + 1) {
        local_98 = Len[nz] + local_98;
      }
      if (Info != (c_float *)0x0) {
        *Info = 0.0;
        Info[1] = (double)n;
        Info[2] = (double)(long)cVar1;
        Info[3] = local_90;
        Info[4] = (double)(long)sym;
        auVar6._8_4_ = (int)(local_98 >> 0x20);
        auVar6._0_8_ = local_98;
        auVar6._12_4_ = 0x45300000;
        Info[5] = (auVar6._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)local_98) - 4503599627370496.0);
      }
      return local_98;
    }
    pj = Ap[nz];
    lVar2 = Ap[nz + 1];
    while (pj < lVar2) {
      lVar3 = Ai[pj];
      if (nz <= lVar3) {
        if (lVar3 == nz) {
          pj = pj + 1;
          sym = (c_float)((long)sym + 1);
        }
        break;
      }
      Len[lVar3] = Len[lVar3] + 1;
      Len[nz] = Len[nz] + 1;
      pj = pj + 1;
      lVar4 = Ap[lVar3 + 1];
      for (nzdiag = Tp[lVar3]; nzdiag < lVar4; nzdiag = nzdiag + 1) {
        lVar5 = Ai[nzdiag];
        if (nz <= lVar5) {
          if (lVar5 == nz) {
            nzdiag = nzdiag + 1;
            nzaat = nzaat + 1;
          }
          break;
        }
        Len[lVar5] = Len[lVar5] + 1;
        Len[lVar3] = Len[lVar3] + 1;
      }
      Tp[lVar3] = nzdiag;
    }
    Tp[nz] = pj;
    nz = nz + 1;
  } while( true );
}

Assistant:

GLOBAL size_t AMD_aat	/* returns nz in A+A' */
(
    Int n,
    const Int Ap [ ],
    const Int Ai [ ],
    Int Len [ ],	/* Len [j]: length of column j of A+A', excl diagonal*/
    Int Tp [ ],		/* workspace of size n */
    c_float Info [ ]
)
{
    Int p1, p2, p, i, j, pj, pj2, k, nzdiag, nzboth, nz ;
    c_float sym ;
    size_t nzaat ;

#ifndef NDEBUG
    AMD_debug_init ("AMD AAT") ;
    for (k = 0 ; k < n ; k++) Tp [k] = EMPTY ;
    ASSERT (AMD_valid (n, n, Ap, Ai) == AMD_OK) ;
#endif

    if (Info != (c_float *) NULL)
    {
	/* clear the Info array, if it exists */
	for (i = 0 ; i < AMD_INFO ; i++)
	{
	    Info [i] = EMPTY ;
	}
	Info [AMD_STATUS] = AMD_OK ;
    }

    for (k = 0 ; k < n ; k++)
    {
	Len [k] = 0 ;
    }

    nzdiag = 0 ;
    nzboth = 0 ;
    nz = Ap [n] ;

    for (k = 0 ; k < n ; k++)
    {
	p1 = Ap [k] ;
	p2 = Ap [k+1] ;
	AMD_DEBUG2 (("\nAAT Column: "ID" p1: "ID" p2: "ID"\n", k, p1, p2)) ;

	/* construct A+A' */
	for (p = p1 ; p < p2 ; )
	{
	    /* scan the upper triangular part of A */
	    j = Ai [p] ;
	    if (j < k)
	    {
		/* entry A (j,k) is in the strictly upper triangular part,
		 * add both A (j,k) and A (k,j) to the matrix A+A' */
		Len [j]++ ;
		Len [k]++ ;
		AMD_DEBUG3 (("    upper ("ID","ID") ("ID","ID")\n", j,k, k,j));
		p++ ;
	    }
	    else if (j == k)
	    {
		/* skip the diagonal */
		p++ ;
		nzdiag++ ;
		break ;
	    }
	    else /* j > k */
	    {
		/* first entry below the diagonal */
		break ;
	    }
	    /* scan lower triangular part of A, in column j until reaching
	     * row k.  Start where last scan left off. */
	    ASSERT (Tp [j] != EMPTY) ;
	    ASSERT (Ap [j] <= Tp [j] && Tp [j] <= Ap [j+1]) ;
	    pj2 = Ap [j+1] ;
	    for (pj = Tp [j] ; pj < pj2 ; )
	    {
		i = Ai [pj] ;
		if (i < k)
		{
		    /* A (i,j) is only in the lower part, not in upper.
		     * add both A (i,j) and A (j,i) to the matrix A+A' */
		    Len [i]++ ;
		    Len [j]++ ;
		    AMD_DEBUG3 (("    lower ("ID","ID") ("ID","ID")\n",
			i,j, j,i)) ;
		    pj++ ;
		}
		else if (i == k)
		{
		    /* entry A (k,j) in lower part and A (j,k) in upper */
		    pj++ ;
		    nzboth++ ;
		    break ;
		}
		else /* i > k */
		{
		    /* consider this entry later, when k advances to i */
		    break ;
		}
	    }
	    Tp [j] = pj ;
	}
	/* Tp [k] points to the entry just below the diagonal in column k */
	Tp [k] = p ;
    }

    /* clean up, for remaining mismatched entries */
    for (j = 0 ; j < n ; j++)
    {
	for (pj = Tp [j] ; pj < Ap [j+1] ; pj++)
	{
	    i = Ai [pj] ;
	    /* A (i,j) is only in the lower part, not in upper.
	     * add both A (i,j) and A (j,i) to the matrix A+A' */
	    Len [i]++ ;
	    Len [j]++ ;
	    AMD_DEBUG3 (("    lower cleanup ("ID","ID") ("ID","ID")\n",
		i,j, j,i)) ;
	}
    }

    /* --------------------------------------------------------------------- */
    /* compute the symmetry of the nonzero pattern of A */
    /* --------------------------------------------------------------------- */

    /* Given a matrix A, the symmetry of A is:
     *	B = tril (spones (A), -1) + triu (spones (A), 1) ;
     *  sym = nnz (B & B') / nnz (B) ;
     *  or 1 if nnz (B) is zero.
     */

    if (nz == nzdiag)
    {
	sym = 1 ;
    }
    else
    {
	sym = (2 * (c_float) nzboth) / ((c_float) (nz - nzdiag)) ;
    }

    nzaat = 0 ;
    for (k = 0 ; k < n ; k++)
    {
	nzaat += Len [k] ;
    }

    AMD_DEBUG1 (("AMD nz in A+A', excluding diagonal (nzaat) = %g\n",
	(c_float) nzaat)) ;
    AMD_DEBUG1 (("   nzboth: "ID" nz: "ID" nzdiag: "ID" symmetry: %g\n",
		nzboth, nz, nzdiag, sym)) ;

    if (Info != (c_float *) NULL)
    {
	Info [AMD_STATUS] = AMD_OK ;
	Info [AMD_N] = n ;
	Info [AMD_NZ] = nz ;
	Info [AMD_SYMMETRY] = sym ;	    /* symmetry of pattern of A */
	Info [AMD_NZDIAG] = nzdiag ;	    /* nonzeros on diagonal of A */
	Info [AMD_NZ_A_PLUS_AT] = nzaat ;   /* nonzeros in A+A' */
    }

    return (nzaat) ;
}